

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

void __thiscall chatter::Protocol::update(Protocol *this,Peer *peer,uint64_t timestamp)

{
  Host *pHVar1;
  ptr e;
  undefined1 local_51;
  Event *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  ptr local_40;
  ptr local_30;
  
  if (peer != (Peer *)0x0) {
    if (peer->m_state - CONNECTION_REQUESTED < 3) {
      if (timestamp - peer->m_connect_ts < 0x1389) {
        do_resends(this,peer,timestamp);
        return;
      }
      if (peer->m_is_incoming_connection == false) {
        local_50 = (Event *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chatter::Event,std::allocator<chatter::Event>>
                  (&local_48,&local_50,(allocator<chatter::Event> *)&local_51);
        local_50->type = PEER_UNABLE_TO_CONNECT;
        (local_50->address).m_address = (peer->m_address).m_address;
        (local_50->address).m_port = (peer->m_address).m_port;
        pHVar1 = this->m_host;
        local_30.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
        local_30.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_48._M_pi;
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          }
        }
        Host::queue_event(pHVar1,&local_30);
        if (local_30.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_30.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        }
      }
      Peer::reset(peer);
    }
    else if (peer->m_state == CONNECTED) {
      if (20000 < timestamp - peer->m_last_recv_ts) {
        local_50 = (Event *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chatter::Event,std::allocator<chatter::Event>>
                  (&local_48,&local_50,(allocator<chatter::Event> *)&local_51);
        local_50->type = PEER_TIMED_OUT;
        (local_50->address).m_address = (peer->m_address).m_address;
        (local_50->address).m_port = (peer->m_address).m_port;
        pHVar1 = this->m_host;
        local_40.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
        local_40.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_48._M_pi;
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          }
        }
        Host::queue_event(pHVar1,&local_40);
        if (local_40.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        Peer::reset(peer);
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        }
      }
      if (1000 < timestamp - peer->m_last_rtt_ts) {
        service_rtt(this,peer,timestamp);
      }
      do_resends(this,peer,timestamp);
    }
  }
  return;
}

Assistant:

void Protocol::update(Peer* peer, uint64_t timestamp)
{
    if (!peer)
        return;

    switch (peer->m_state) {
        case PeerState::DISCONNECTED:
            return; /* We shouldn't be given a disconnected peer o.O */

        case PeerState::CONNECTION_REQUESTED:
        case PeerState::CONNECTION_RESPONDED:
        case PeerState::CONNECTION_ACKNOWLEDGED:
            {
                /* Check for long-running connection attempts and kill them */
                uint64_t time_since_connect = timestamp - peer->m_connect_ts;
                if (time_since_connect > kConnectTimeOut) {
                    if (!peer->m_is_incoming_connection) {
                        auto e = Event::create(EventType::PEER_UNABLE_TO_CONNECT);
                        e->address = peer->m_address;
                        m_host->queue_event(e);
                    }
                    peer->reset();
                    return;
                }
                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        case PeerState::CONNECTED:
            {
                /* Disconnect detection */
                if (detect_disconnect(peer, timestamp)) {
                    auto e = Event::create(EventType::PEER_TIMED_OUT);
                    e->address = peer->m_address;
                    m_host->queue_event(e);
                    peer->reset();
                }

                /* Keep RTT calculations happening */
                uint64_t time_since_last_rtt = timestamp - peer->m_last_rtt_ts;
                if (time_since_last_rtt > kPingInterval)
                    service_rtt(peer, timestamp);

                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        default:
            break;
    }
}